

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

code_int getcode(FILE *ifp)

{
  char cVar1;
  Byte BVar2;
  sbyte sVar3;
  long lVar4;
  int local_48;
  code_int local_40;
  byte *pbStack_38;
  int tmp_size;
  char_type *bp;
  size_t i;
  byte local_20;
  int bits;
  int r_off;
  code_int code;
  FILE *ifp_local;
  
  if (offset < 0) {
    __assert_fail("offset >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mjwoodcock[P]nspark/compress.c"
                  ,0x1a4,"code_int getcode(FILE *)");
  }
  if (((0 < clear_flg) || (size <= (ulong)(long)offset)) || (maxcode < free_ent)) {
    if (maxcode < free_ent) {
      n_bits = n_bits + 1;
      if (n_bits == maxbits) {
        local_40 = maxmaxcode;
      }
      else {
        local_40 = (1 << ((byte)n_bits & 0x1f)) + -1;
      }
      maxcode = local_40;
    }
    if (0 < clear_flg) {
      n_bits = 9;
      maxcode = 0x1ff;
      clear_flg = 0;
    }
    if (readsize == 0) {
      return -1;
    }
    if (readsize < n_bits) {
      local_48 = (int)readsize;
    }
    else {
      local_48 = n_bits;
    }
    if (local_48 < 0) {
      __assert_fail("tmp_size >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mjwoodcock[P]nspark/compress.c"
                    ,0x1bb,"code_int getcode(FILE *)");
    }
    size = fread(getcode::buf,1,(long)local_48,(FILE *)ifp);
    if (size == 0) {
      size = 0;
      return -1;
    }
    for (bp = (char_type *)0x0; bp < size; bp = bp + 1) {
      BVar2 = ungarble(bp[0x169720]);
      bp[0x169720] = BVar2;
    }
    readsize = readsize - size;
    offset = 0;
    size = size * 8 - (long)(n_bits + -1);
  }
  lVar4 = (long)(offset >> 3);
  sVar3 = (sbyte)(offset & 7U);
  bits = (int)(uint)getcode::buf[lVar4] >> sVar3;
  i._4_4_ = n_bits - (8 - (offset & 7U));
  cVar1 = -sVar3;
  local_20 = cVar1 + 8;
  pbStack_38 = getcode::buf + lVar4 + 1;
  if (7 < i._4_4_) {
    pbStack_38 = getcode::buf + lVar4 + 2;
    bits = (uint)getcode::buf[lVar4 + 1] << (local_20 & 0x1f) | bits;
    local_20 = cVar1 + 0x10;
    i._4_4_ = i._4_4_ + -8;
  }
  offset = n_bits + offset;
  return (uint)(*pbStack_38 & rmask[i._4_4_]) << (local_20 & 0x1f) | bits;
}

Assistant:

static code_int
getcode(FILE *ifp)
{
	register code_int code;
	static char_type buf[COMPRESSBITS];
	register int r_off, bits;
	size_t i;
	/* BB changed next line. We are doing pointer-artithmatics
	   and that can be dangerous if other than normalized (huge)
	   pointers are being used. */
	register char_type NSHUGE *bp = buf;

	assert(offset >= 0);

	if (clear_flg > 0 || (size_t) offset >= size || free_ent > maxcode)
	{
		int tmp_size;
		/*
		 * If the next entry will be too big for the current code
		 * size, then we must increase the size.  This implies
		 * reading a new buffer full, too.
		 */
		if (free_ent > maxcode)
		{
			n_bits++;
			maxcode = n_bits == maxbits ? maxmaxcode : MAXCODE(n_bits);
		}
		if (clear_flg > 0)
		{
			maxcode = MAXCODE(n_bits = INIT_BITS);
			clear_flg = 0;
		}
		if (readsize == 0)
			return (-1);
		tmp_size = readsize < n_bits ? readsize : n_bits;
		assert(tmp_size >= 0);
		size = fread(buf, 1, tmp_size, ifp);
		if (size == 0)
			return (-1);		/* end of file */
		for (i = 0; i < size; i++)
		{
			buf[i] = ungarble(buf[i]);
		}
		readsize -= size;
		offset = 0;
		/* Round size down to integral number of codes */
		size = (size << 3) - (n_bits - 1);
	}
	r_off = (int)offset;
	bits = n_bits;

	/*
	 * Get to the first byte.
	 */
	bp += (r_off >> 3);
	r_off &= 7;
	/* Get first part (low order bits) */

	code = (*bp++ >> r_off);
	bits -= (8 - r_off);
	r_off = 8 - r_off;			/* now, offset into code word */
	/* Get any 8 bit parts in the middle (<=1 for up to 16 bits). */
	if (bits >= 8)
	{
		code |= *bp++ << r_off;
		r_off += 8;
		bits -= 8;
	}
	/* high order bits. */
	code |= (*bp & rmask[bits]) << r_off;
	offset += n_bits;

	return (code);
}